

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O1

void __thiscall
TApp_MultipleSubcomMatchingWithCase_Test::TestBody(TApp_MultipleSubcomMatchingWithCase_Test *this)

{
  bool bVar1;
  App *this_00;
  App *this_01;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  AssertHelper local_b0;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"first","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"","");
  this_01 = &(this->super_TApp).app;
  this_00 = CLI::App::add_subcommand(this_01,&local_48,&local_68);
  CLI::App::ignore_case(this_00,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"fIrst","");
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
    CLI::App::add_subcommand(this_01,&local_88,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)&local_b8);
  testing::internal::AssertHelper::AssertHelper
            (&local_b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
             ,0x53,
             "Expected: app.add_subcommand(\"fIrst\") throws an exception of type CLI::OptionAlreadyAdded.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_b8);
  testing::internal::AssertHelper::~AssertHelper(&local_b0);
  if (((local_b8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_b8.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_b8.ptr_ + 8))();
  }
  return;
}

Assistant:

TEST_F(TApp, MultipleSubcomMatchingWithCase) {
    app.add_subcommand("first")->ignore_case();
    EXPECT_THROW(app.add_subcommand("fIrst"), CLI::OptionAlreadyAdded);
}